

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O1

void rshift(Bigint *b,int k)

{
  ULong *pUVar1;
  ULong *pUVar2;
  sbyte sVar3;
  int iVar4;
  ULong *pUVar5;
  uint uVar6;
  uint *puVar7;
  uint uVar8;
  
  pUVar1 = b->x;
  uVar6 = (uint)k >> 5;
  uVar8 = b->wds;
  pUVar5 = pUVar1;
  if ((int)uVar6 < (int)uVar8) {
    pUVar2 = pUVar1 + uVar8;
    if ((k & 0x1fU) == 0) {
      if (uVar6 < uVar8) {
        do {
          puVar7 = (uint *)((long)pUVar5 + (ulong)(uVar6 << 2));
          *pUVar5 = *puVar7;
          pUVar5 = pUVar5 + 1;
        } while (puVar7 + 1 < pUVar2);
      }
    }
    else {
      puVar7 = pUVar1 + uVar6 + 1;
      sVar3 = (sbyte)(k & 0x1fU);
      uVar8 = pUVar1[uVar6] >> sVar3;
      if (puVar7 < pUVar2) {
        do {
          uVar6 = *puVar7;
          *pUVar5 = uVar6 << (0x20U - sVar3 & 0x1f) | uVar8;
          uVar8 = uVar6 >> sVar3;
          pUVar5 = pUVar5 + 1;
          puVar7 = puVar7 + 1;
        } while (puVar7 < pUVar2);
      }
      *pUVar5 = uVar8;
      pUVar5 = pUVar5 + (uVar8 != 0);
    }
  }
  iVar4 = (int)((ulong)((long)pUVar5 - (long)pUVar1) >> 2);
  b->wds = iVar4;
  if (iVar4 == 0) {
    *pUVar1 = 0;
  }
  return;
}

Assistant:

static void
rshift(Bigint *b, int k)
{
	ULong *x, *x1, *xe, y;
	int n;

	x = x1 = b->x;
	n = k >> kshift;
	if (n < b->wds) {
		xe = x + b->wds;
		x += n;
		if (k &= kmask) {
			n = 32 - k;
			y = *x++ >> k;
			while(x < xe) {
				*x1++ = (y | (*x << n)) & 0xffffffff;
				y = *x++ >> k;
				}
			if ((*x1 = y) !=0)
				x1++;
			}
		else
			while(x < xe)
				*x1++ = *x++;
		}
	if ((b->wds = x1 - b->x) == 0)
		b->x[0] = 0;
	}